

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void get_with_index_address_mode
               (m68k_info *info,cs_m68k_op *op,uint instruction,uint size,_Bool is_pc)

{
  ulong uVar1;
  m68k_reg mVar2;
  uint uVar3;
  uint uVar4;
  m68k_address_mode mVar5;
  ulong uVar6;
  int iVar7;
  char cVar8;
  int iVar9;
  char cVar10;
  uint uVar11;
  uint uVar12;
  
  uVar12 = info->pc;
  uVar1 = info->code_len;
  iVar9 = (int)info->baseAddress;
  uVar4 = info->address_mask;
  uVar6 = (ulong)(uVar4 & uVar12 - iVar9);
  uVar11 = 0xaaaa;
  if (uVar6 + 2 <= uVar1) {
    uVar11 = (uint)(ushort)(*(ushort *)(info->code + uVar6) << 8 |
                           *(ushort *)(info->code + uVar6) >> 8);
  }
  info->pc = uVar12 + 2;
  op->address_mode = M68K_AM_AREGI_INDEX_BASE_DISP;
  cVar10 = (char)uVar11;
  cVar8 = (char)size;
  if ((uVar11 >> 8 & 1) == 0) {
    (op->mem).index_reg = (uVar11 >> 0xc & 7) + (uint)(0x7fff < uVar11) * 8 + M68K_REG_D0;
    (op->mem).index_size = (byte)(uVar11 >> 0xb) & 1;
    if (cVar10 == '\0') {
      if (cVar8 == '\0') {
        (op->mem).base_reg = (instruction & 7) + M68K_REG_A0;
      }
      else {
        (op->mem).base_reg = M68K_REG_PC;
        op->address_mode = M68K_AM_PCI_INDEX_BASE_DISP;
      }
    }
    else {
      mVar2 = M68K_REG_PC;
      if (cVar8 == '\0') {
        mVar2 = (instruction & 7) + M68K_REG_A0;
      }
      (op->mem).base_reg = mVar2;
      op->address_mode = (size & 0xff) * 5 + M68K_AM_AREGI_INDEX_8_BIT_DISP;
      (op->mem).disp = (short)cVar10;
    }
    uVar12 = uVar11 >> 9 & 3;
    if (uVar12 != 0) {
      (op->mem).scale = (uint8_t)(1 << (sbyte)uVar12);
    }
  }
  else {
    (op->mem).base_reg = M68K_REG_INVALID;
    (op->mem).index_reg = M68K_REG_INVALID;
    uVar3 = 0;
    if (0x10 < (uVar11 & 0x30)) {
      if ((uVar11 & 0x30) == 0x30) {
        uVar3 = peek_imm_32(info);
        iVar7 = 6;
      }
      else {
        uVar6 = (ulong)(uVar4 & (uVar12 + 2) - iVar9);
        uVar3 = 0xaaaa;
        iVar7 = 4;
        if (uVar6 + 2 <= uVar1) {
          uVar3 = (uint)(ushort)(*(ushort *)(info->code + uVar6) << 8 |
                                *(ushort *)(info->code + uVar6) >> 8);
        }
      }
      info->pc = uVar12 + iVar7;
    }
    uVar12 = 0;
    (op->mem).in_disp = uVar3;
    if ((~uVar11 & 0x44) != 0 && 1 < (uVar11 & 3)) {
      if ((uVar11 & 3) == 3) {
        uVar12 = peek_imm_32(info);
        uVar4 = info->pc + 4;
      }
      else {
        uVar6 = (ulong)(uVar4 & info->pc - iVar9);
        uVar12 = 0xaaaa;
        if (uVar6 + 2 <= uVar1) {
          uVar12 = (uint)(ushort)(*(ushort *)(info->code + uVar6) << 8 |
                                 *(ushort *)(info->code + uVar6) >> 8);
        }
        uVar4 = info->pc + 2;
      }
      info->pc = uVar4;
    }
    (op->mem).out_disp = uVar12;
    if (-1 < cVar10) {
      mVar2 = M68K_REG_PC;
      if (cVar8 == '\0') {
        mVar2 = (instruction & 7) + M68K_REG_A0;
      }
      (op->mem).base_reg = mVar2;
    }
    if ((uVar11 & 0x40) == 0) {
      mVar2 = (uVar11 >> 0xc & 7) + M68K_REG_A0;
      if (uVar11 < 0x8000) {
        mVar2 = (uVar11 >> 0xc) + M68K_REG_D0;
      }
      (op->mem).index_reg = mVar2;
      (op->mem).index_size = (byte)(uVar11 >> 0xb) & 1;
      uVar12 = uVar11 >> 9 & 3;
      if (uVar12 != 0) {
        (op->mem).scale = (uint8_t)(1 << (sbyte)uVar12);
      }
    }
    if ((uVar11 & 7) - 1 < 3) {
      mVar5 = (size & 0xff) * 5 + M68K_AM_MEMI_PRE_INDEX;
    }
    else {
      if ((uVar11 & 7) < 5) {
        return;
      }
      mVar5 = (size & 0xff) * 5 + M68K_AM_MEMI_POST_INDEX;
    }
    op->address_mode = mVar5;
  }
  return;
}

Assistant:

static void get_with_index_address_mode(m68k_info *info, cs_m68k_op* op, uint instruction, uint size, bool is_pc)
{
	uint extension = read_imm_16(info);

	op->address_mode = M68K_AM_AREGI_INDEX_BASE_DISP;

	if (EXT_FULL(extension)) {
		uint preindex;
		uint postindex;

		op->mem.base_reg = M68K_REG_INVALID;
		op->mem.index_reg = M68K_REG_INVALID;

		/* Not sure how to deal with this?
		   if (EXT_EFFECTIVE_ZERO(extension)) {
		   strcpy(mode, "0");
		   break;
		   }
		 */

		op->mem.in_disp = EXT_BASE_DISPLACEMENT_PRESENT(extension) ? (EXT_BASE_DISPLACEMENT_LONG(extension) ? read_imm_32(info) : read_imm_16(info)) : 0;
		op->mem.out_disp = EXT_OUTER_DISPLACEMENT_PRESENT(extension) ? (EXT_OUTER_DISPLACEMENT_LONG(extension) ? read_imm_32(info) : read_imm_16(info)) : 0;

		if (EXT_BASE_REGISTER_PRESENT(extension)) {
			if (is_pc) {
				op->mem.base_reg = M68K_REG_PC;
			} else {
				op->mem.base_reg = M68K_REG_A0 + (instruction & 7);
			}
		}

		if (EXT_INDEX_REGISTER_PRESENT(extension)) {
			if (EXT_INDEX_AR(extension)) {
				op->mem.index_reg = M68K_REG_A0 + EXT_INDEX_REGISTER(extension);
			} else {
				op->mem.index_reg = M68K_REG_D0 + EXT_INDEX_REGISTER(extension);
			}

			op->mem.index_size = EXT_INDEX_LONG(extension) ? 1 : 0;

			if (EXT_INDEX_SCALE(extension)) {
				op->mem.scale = 1 << EXT_INDEX_SCALE(extension);
			}
		}

		preindex = (extension & 7) > 0 && (extension & 7) < 4;
		postindex = (extension & 7) > 4;

		if (preindex) {
			op->address_mode = is_pc ? M68K_AM_PC_MEMI_PRE_INDEX : M68K_AM_MEMI_PRE_INDEX;
		} else if (postindex) {
			op->address_mode = is_pc ? M68K_AM_PC_MEMI_POST_INDEX : M68K_AM_MEMI_POST_INDEX;
		}

		return;
	}

	op->mem.index_reg = (EXT_INDEX_AR(extension) ? M68K_REG_A0 : M68K_REG_D0) + EXT_INDEX_REGISTER(extension);
	op->mem.index_size = EXT_INDEX_LONG(extension) ? 1 : 0;

	if (EXT_8BIT_DISPLACEMENT(extension) == 0) {
		if (is_pc) {
			op->mem.base_reg = M68K_REG_PC;
			op->address_mode = M68K_AM_PCI_INDEX_BASE_DISP;
		} else {
			op->mem.base_reg = M68K_REG_A0 + (instruction & 7);
		}
	} else {
		if (is_pc) {
			op->mem.base_reg = M68K_REG_PC;
			op->address_mode = M68K_AM_PCI_INDEX_8_BIT_DISP;
		} else {
			op->mem.base_reg = M68K_REG_A0 + (instruction & 7);
			op->address_mode = M68K_AM_AREGI_INDEX_8_BIT_DISP;
		}

		op->mem.disp = (int8_t)(extension & 0xff);
	}

	if (EXT_INDEX_SCALE(extension)) {
		op->mem.scale = 1 << EXT_INDEX_SCALE(extension);
	}
}